

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PimplImpl.h
# Opt level: O0

void __thiscall celero::Pimpl<celero::Archive::Impl>::Pimpl(Pimpl<celero::Archive::Impl> *this)

{
  Impl *this_00;
  Pimpl<celero::Archive::Impl> *this_local;
  
  this_00 = (Impl *)operator_new(0x38);
  Archive::Impl::Impl(this_00);
  std::unique_ptr<celero::Archive::Impl,std::default_delete<celero::Archive::Impl>>::
  unique_ptr<std::default_delete<celero::Archive::Impl>,void>
            ((unique_ptr<celero::Archive::Impl,std::default_delete<celero::Archive::Impl>> *)this,
             this_00);
  return;
}

Assistant:

Pimpl<T>::Pimpl() : _pimpl(new T())
	{
	}